

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::Flower::writeToData
          (Flower *this,Expression *ref,Expression *value,Index fieldIndex)

{
  anon_class_24_3_7037b1ec func;
  bool bVar1;
  LocationIndex LVar2;
  Index depth;
  PossibleContents *pPVar3;
  pointer this_00;
  HeapType type;
  ConeType CVar4;
  bool local_182;
  Index normalizedDepth;
  Type local_118;
  ConeType cone;
  ExpressionLocation local_100;
  variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
  local_f0 [32];
  undefined1 local_d0 [8];
  PossibleContents valueContents;
  undefined1 local_98 [8];
  PossibleContents maximalContents;
  variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
  local_68 [32];
  undefined1 local_48 [8];
  PossibleContents refContents;
  Index fieldIndex_local;
  Expression *value_local;
  Expression *ref_local;
  Flower *this_local;
  
  maximalContents.value.
  super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ._24_8_ = ref;
  refContents.value.
  super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  .
  super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ._28_4_ = fieldIndex;
  std::
  variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
  ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
            (local_68,(ExpressionLocation *)
                      ((long)&maximalContents.value.
                              super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                              .
                              super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                              .
                              super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                              .
                              super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                              .
                              super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                      + 0x18));
  LVar2 = getIndex(this,(Location *)local_68);
  pPVar3 = getContents(this,LVar2);
  PossibleContents::PossibleContents((PossibleContents *)local_48,pPVar3);
  PossibleContents::fullConeType((PossibleContents *)local_98,(Type)(ref->type).id);
  bVar1 = PossibleContents::isSubContents((PossibleContents *)local_48,(PossibleContents *)local_98)
  ;
  if (!bVar1) {
    __assert_fail("PossibleContents::isSubContents(refContents, maximalContents)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                  ,0xba4,
                  "void wasm::(anonymous namespace)::Flower::writeToData(Expression *, Expression *, Index)"
                 );
  }
  local_100.tupleIndex = 0;
  local_100.expr = value;
  std::
  variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::LocalLocation,wasm::ResultLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::CaughtExnRefLocation,wasm::NullLocation,wasm::ConeReadLocation>
  ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>(local_f0,&local_100);
  LVar2 = getIndex(this,(Location *)local_f0);
  pPVar3 = getContents(this,LVar2);
  PossibleContents::PossibleContents((PossibleContents *)local_d0,pPVar3);
  bVar1 = PossibleContents::isNone((PossibleContents *)local_48);
  if (!bVar1) {
    bVar1 = PossibleContents::isNull((PossibleContents *)local_48);
    if (!bVar1) {
      bVar1 = PossibleContents::isGlobal((PossibleContents *)local_48);
      local_182 = true;
      if (!bVar1) {
        local_182 = PossibleContents::isConeType((PossibleContents *)local_48);
      }
      if (local_182 == false) {
        __assert_fail("refContents.isGlobal() || refContents.isConeType()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                      ,0xbc4,
                      "void wasm::(anonymous namespace)::Flower::writeToData(Expression *, Expression *, Index)"
                     );
      }
      CVar4 = PossibleContents::getCone((PossibleContents *)local_48);
      local_118 = CVar4.type.id;
      cone.type.id._0_4_ = CVar4.depth;
      depth = getNormalizedConeDepth(this,local_118,(Index)cone.type.id);
      this_00 = std::unique_ptr<wasm::SubTypes,_std::default_delete<wasm::SubTypes>_>::operator->
                          (&this->subTypes);
      type = wasm::Type::getHeapType(&local_118);
      func.this = this;
      func.fieldIndex =
           (Index *)((long)&refContents.value.
                            super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                            .
                            super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                            .
                            super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                            .
                            super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                            .
                            super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                    + 0x1c);
      func.valueContents = (PossibleContents *)local_d0;
      SubTypes::
      iterSubTypes<wasm::(anonymous_namespace)::Flower::writeToData(wasm::Expression*,wasm::Expression*,unsigned_int)::__0>
                (this_00,type,depth,func);
      cone._12_4_ = 0;
      goto LAB_018ce95e;
    }
  }
  cone._12_4_ = 1;
LAB_018ce95e:
  PossibleContents::~PossibleContents((PossibleContents *)local_d0);
  PossibleContents::~PossibleContents((PossibleContents *)local_98);
  PossibleContents::~PossibleContents((PossibleContents *)local_48);
  return;
}

Assistant:

void Flower::writeToData(Expression* ref, Expression* value, Index fieldIndex) {
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
  std::cout << "    add special writes\n";
#endif

  auto refContents = getContents(getIndex(ExpressionLocation{ref, 0}));

#ifndef NDEBUG
  // We must not have anything in the reference that is invalid for the wasm
  // type there.
  auto maximalContents = PossibleContents::fullConeType(ref->type);
  assert(PossibleContents::isSubContents(refContents, maximalContents));
#endif

  // We could set up links here as we do for reads, but as we get to this code
  // in any case, we can just flow the values forward directly. This avoids
  // adding any links (edges) to the graph (and edges are what we want to avoid
  // adding, as there can be a quadratic number of them). In other words, we'll
  // loop over the places we need to send info to, which we can figure out in a
  // simple way, and by doing so we avoid materializing edges into the graph.
  //
  // Note that this is different from readFromData, above, which does add edges
  // to the graph (and works hard to add as few as possible, see the "canonical
  // cone reads" logic). The difference is because readFromData must "subscribe"
  // to get notifications from the relevant DataLocations. But when writing that
  // is not a problem: whenever a change happens in the reference or the value
  // of a struct.set then this function will get called, and those are the only
  // things we care about. And we can then just compute the values we are
  // sending (based on the current contents of the reference and the value), and
  // where we should send them to, and do that right here. (And as commented in
  // readFromData, that is guaranteed to give us the right result in the end: at
  // every point in time we send the right data, so when the flow is finished
  // we've sent information based on the final and correct information about our
  // reference and value.)

  auto valueContents = getContents(getIndex(ExpressionLocation{value, 0}));

  // See the related comment in readFromData() as to why these are the only
  // things we need to check, and why the assertion afterwards contains the only
  // things possible.
  if (refContents.isNone() || refContents.isNull()) {
    return;
  }
  assert(refContents.isGlobal() || refContents.isConeType());

  // As in readFromData, normalize to the proper cone.
  auto cone = refContents.getCone();
  auto normalizedDepth = getNormalizedConeDepth(cone.type, cone.depth);

  subTypes->iterSubTypes(
    cone.type.getHeapType(), normalizedDepth, [&](HeapType type, Index depth) {
      auto heapLoc = DataLocation{type, fieldIndex};
      updateContents(heapLoc, valueContents);
    });
}